

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O0

bool __thiscall
DIS::LinearObjectStatePdu::operator==(LinearObjectStatePdu *this,LinearObjectStatePdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  LinearObjectStatePdu *rhs_local;
  LinearObjectStatePdu *this_local;
  
  idx._7_1_ = SyntheticEnvironmentFamilyPdu::operator==
                        (&this->super_SyntheticEnvironmentFamilyPdu,
                         &rhs->super_SyntheticEnvironmentFamilyPdu);
  bVar1 = EntityID::operator==(&this->_objectID,&rhs->_objectID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EntityID::operator==(&this->_referencedObjectID,&rhs->_referencedObjectID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_updateNumber != rhs->_updateNumber) {
    idx._7_1_ = false;
  }
  if (this->_forceID != rhs->_forceID) {
    idx._7_1_ = false;
  }
  bVar1 = SimulationAddress::operator==(&this->_requesterID,&rhs->_requesterID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = SimulationAddress::operator==(&this->_receivingID,&rhs->_receivingID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = ObjectType::operator==(&this->_objectType,&rhs->_objectType);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
            size(&this->_linearSegmentParameters);
    if (sVar2 <= local_28) break;
    this_00 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
              ::operator[](&this->_linearSegmentParameters,local_28);
    rhs_00 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
             ::operator[](&rhs->_linearSegmentParameters,local_28);
    bVar1 = LinearSegmentParameter::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool LinearObjectStatePdu::operator ==(const LinearObjectStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SyntheticEnvironmentFamilyPdu::operator==(rhs);

     if( ! (_objectID == rhs._objectID) ) ivarsEqual = false;
     if( ! (_referencedObjectID == rhs._referencedObjectID) ) ivarsEqual = false;
     if( ! (_updateNumber == rhs._updateNumber) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_requesterID == rhs._requesterID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_objectType == rhs._objectType) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _linearSegmentParameters.size(); idx++)
     {
        if( ! ( _linearSegmentParameters[idx] == rhs._linearSegmentParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }